

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_math_clz32(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint uVar1;
  int iVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  JSValue JVar5;
  uint32_t a;
  
  iVar2 = JS_ToInt32(ctx,(int32_t *)&a,*argv);
  if (a == 0) {
    JVar3.float64 = 1.58101006669199e-322;
  }
  else {
    uVar1 = 0x1f;
    if (a != 0) {
      for (; a >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    JVar3._0_4_ = uVar1 ^ 0x1f;
    JVar3._4_4_ = 0;
  }
  if (iVar2 != 0) {
    JVar3.float64 = 0.0;
  }
  JVar4.float64 = 2.96439387504748e-323;
  if (iVar2 == 0) {
    JVar4.float64 = 0.0;
  }
  JVar5.tag = (int64_t)JVar4.ptr;
  JVar5.u.float64 = JVar3.float64;
  return JVar5;
}

Assistant:

static JSValue js_math_clz32(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    uint32_t a, r;

    if (JS_ToUint32(ctx, &a, argv[0]))
        return JS_EXCEPTION;
    if (a == 0)
        r = 32;
    else
        r = clz32(a);
    return JS_NewInt32(ctx, r);
}